

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O0

void __thiscall TRM::TGAImage::clearColor(TGAImage *this,TGAColor *c)

{
  ulong local_28;
  size_t j;
  size_t i;
  TGAColor *c_local;
  TGAImage *this_local;
  
  for (j = 0; j < (ulong)(long)this->width; j = j + 1) {
    for (local_28 = 0; local_28 < (ulong)(long)this->height; local_28 = local_28 + 1) {
      set(this,(int)j,(int)local_28,c);
    }
  }
  return;
}

Assistant:

void TGAImage::clearColor(const TGAColor &c) {
  for (size_t i = 0; i < width; i++) {
    for (size_t j = 0; j < height; j++) {
      set(i, j, c);
    }
  }
}